

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cxx
# Opt level: O2

int write_file(char *filename,int selected_only)

{
  int *piVar1;
  int iVar2;
  char *format;
  char **ppcVar3;
  Fl_Type *pFVar4;
  
  iVar2 = open_write(filename);
  if (iVar2 == 0) {
    return 0;
  }
  write_string("# data file for the Fltk User Interface Designer (fluid)\nversion %.4f",
               0x3ff07c84b5dcc63f);
  if (include_H_from_C == 0) {
    write_string("\ndo_not_include_H_from_C");
  }
  if (use_FL_COMMAND != 0) {
    write_string("\nuse_FL_COMMAND");
  }
  if (i18n_type != 0) {
    write_string("\ni18n_type %d");
    write_string("\ni18n_include %s",i18n_include);
    if (i18n_type == 1) {
      format = "\ni18n_function %s";
      ppcVar3 = &i18n_function;
    }
    else {
      if (i18n_type != 2) goto LAB_00198771;
      format = "\ni18n_set %s";
      ppcVar3 = &i18n_set;
      if (*i18n_file != '\0') {
        write_string("\ni18n_file %s");
      }
    }
    write_string(format,*ppcVar3);
  }
LAB_00198771:
  pFVar4 = Fl_Type::first;
  if (selected_only == 0) {
    write_string("\nheader_name");
    write_word(header_file_name);
    write_string("\ncode_name");
    write_word(code_file_name);
    pFVar4 = Fl_Type::first;
  }
  do {
    while( true ) {
      if (pFVar4 == (Fl_Type *)0x0) {
        iVar2 = close_write();
        return iVar2;
      }
      if ((selected_only == 0) || (pFVar4->selected != '\0')) break;
      pFVar4 = pFVar4->next;
    }
    (*pFVar4->_vptr_Fl_Type[0xc])(pFVar4);
    write_string("\n");
    piVar1 = &pFVar4->level;
    do {
      pFVar4 = pFVar4->next;
      if (pFVar4 == (Fl_Type *)0x0) {
        pFVar4 = (Fl_Type *)0x0;
        break;
      }
    } while (*piVar1 < pFVar4->level);
  } while( true );
}

Assistant:

int write_file(const char *filename, int selected_only) {
  if (!open_write(filename)) return 0;
  write_string("# data file for the Fltk User Interface Designer (fluid)\n"
	       "version %.4f",FL_VERSION);
  if(!include_H_from_C)
    write_string("\ndo_not_include_H_from_C");
  if(use_FL_COMMAND)
    write_string("\nuse_FL_COMMAND");
  if (i18n_type) {
    write_string("\ni18n_type %d", i18n_type);
    write_string("\ni18n_include %s", i18n_include);
    switch (i18n_type) {
    case 1 : /* GNU gettext */
	write_string("\ni18n_function %s", i18n_function);
        break;
    case 2 : /* POSIX catgets */
        if (i18n_file[0]) write_string("\ni18n_file %s", i18n_file);
	write_string("\ni18n_set %s", i18n_set);
        break;
    }
  }
  if (!selected_only) {
    write_string("\nheader_name"); write_word(header_file_name);
    write_string("\ncode_name"); write_word(code_file_name);
  }
  for (Fl_Type *p = Fl_Type::first; p;) {
    if (!selected_only || p->selected) {
      p->write();
      write_string("\n");
      int q = p->level;
      for (p = p->next; p && p->level > q; p = p->next) {/*empty*/}
    } else {
      p = p->next;
    }
  }
  return close_write();
}